

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBlendTests.cpp
# Opt level: O1

int __thiscall deqp::gles2::Functional::BlendCase::init(BlendCase *this,EVP_PKEY_CTX *ctx)

{
  TextureFormat *pTVar1;
  Vec4 *pVVar2;
  Vec4 *pVVar3;
  int iVar4;
  int iVar5;
  int extraout_EAX;
  RenderTarget *pRVar6;
  undefined8 uVar7;
  QuadRenderer *this_00;
  ReferenceQuadRenderer *this_01;
  TextureLevel *this_02;
  Context *this_03;
  Vec4 *pVVar8;
  int i;
  long lVar9;
  int i_1;
  long lVar10;
  int i_4;
  Vector<float,_4> res_2;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  Vector<float,_4> res_3;
  TextureFormat local_68;
  TextureFormat TStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38 [8];
  
  this_03 = (this->super_TestCase).m_context;
  pRVar6 = Context::getRenderTarget(this_03);
  iVar4 = (pRVar6->m_pixelFormat).alphaBits;
  if (init()::baseGradientColors == '\0') {
    init((EVP_PKEY_CTX *)this_03);
  }
  pVVar8 = init::baseGradientColors;
  lVar9 = 0;
  do {
    local_58 = 0;
    uStack_50 = 0;
    lVar10 = 0;
    do {
      *(float *)((long)&local_58 + lVar10 * 4) = pVVar8->m_data[lVar10] + -0.5;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    local_48 = 0;
    uStack_40 = 0;
    lVar10 = 0;
    do {
      *(float *)((long)&local_48 + lVar10 * 4) = *(float *)((long)&local_58 + lVar10 * 4) * 0.2;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    local_68.order = R;
    local_68.type = SNORM_INT8;
    TStack_60.order = R;
    TStack_60.type = SNORM_INT8;
    lVar10 = 0;
    do {
      (&local_68.order)[lVar10] = (ChannelOrder)(*(float *)((long)&local_48 + lVar10 * 4) + 0.5);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    pTVar1 = (TextureFormat *)((this->m_firstQuad).color + lVar9);
    *pTVar1 = local_68;
    pTVar1[1] = TStack_60;
    pVVar2 = (this->m_firstQuad).color + lVar9;
    uVar7 = *(undefined8 *)(pVVar2->m_data + 2);
    pVVar3 = (this->m_firstQuadInt).color + lVar9;
    *(undefined8 *)pVVar3->m_data = *(undefined8 *)pVVar2->m_data;
    *(undefined8 *)(pVVar3->m_data + 2) = uVar7;
    lVar10 = 0;
    do {
      local_38[lVar10 + 4] = 1.0;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    local_38[0] = 0.0;
    local_38[1] = 0.0;
    local_38[2] = 0.0;
    local_38[3] = 0.0;
    lVar10 = 0;
    do {
      local_38[lVar10] = local_38[lVar10 + 4] - pVVar8->m_data[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    local_58 = 0;
    uStack_50 = 0;
    lVar10 = 0;
    do {
      *(float *)((long)&local_58 + lVar10 * 4) = local_38[lVar10] + -0.5;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    local_48 = local_58;
    uStack_40 = uStack_50;
    local_68.order = R;
    local_68.type = SNORM_INT8;
    TStack_60.order = R;
    TStack_60.type = SNORM_INT8;
    lVar10 = 0;
    do {
      (&local_68.order)[lVar10] = (ChannelOrder)(*(float *)((long)&local_48 + lVar10 * 4) + 0.5);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    pTVar1 = (TextureFormat *)((this->m_secondQuad).color + lVar9);
    *pTVar1 = local_68;
    pTVar1[1] = TStack_60;
    pVVar2 = (this->m_secondQuad).color + lVar9;
    uVar7 = *(undefined8 *)(pVVar2->m_data + 2);
    pVVar3 = (this->m_secondQuadInt).color + lVar9;
    *(undefined8 *)pVVar3->m_data = *(undefined8 *)pVVar2->m_data;
    *(undefined8 *)(pVVar3->m_data + 2) = uVar7;
    lVar9 = lVar9 + 1;
    pVVar8 = pVVar8 + 1;
  } while (lVar9 != 4);
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar5 = pRVar6->m_width;
  if (0x3f < iVar5) {
    iVar5 = 0x40;
  }
  this->m_viewportW = iVar5;
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar5 = 0x40;
  if (pRVar6->m_height < 0x40) {
    iVar5 = pRVar6->m_height;
  }
  this->m_viewportH = iVar5;
  *(undefined8 *)(this->m_firstQuadInt).posA.m_data = 0;
  *(undefined8 *)(this->m_secondQuadInt).posA.m_data = 0;
  uVar7 = CONCAT44(iVar5 + -1,this->m_viewportW + -1);
  *(undefined8 *)(this->m_firstQuadInt).posB.m_data = uVar7;
  *(undefined8 *)(this->m_secondQuadInt).posB.m_data = uVar7;
  this_00 = (QuadRenderer *)operator_new(0x20);
  deqp::gls::FragmentOpUtil::QuadRenderer::QuadRenderer
            (this_00,((this->super_TestCase).m_context)->m_renderCtx,GLSL_VERSION_100_ES);
  this->m_renderer = this_00;
  this_01 = (ReferenceQuadRenderer *)operator_new(0x11108);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::ReferenceQuadRenderer(this_01);
  this->m_referenceRenderer = this_01;
  this_02 = (TextureLevel *)operator_new(0x28);
  local_68.type = UNORM_INT8;
  local_68.order = RGBA - (iVar4 == 0);
  tcu::TextureLevel::TextureLevel(this_02,&local_68,this->m_viewportW,this->m_viewportH,1);
  this->m_refColorBuffer = this_02;
  this->m_curParamSetNdx = 0;
  return extraout_EAX;
}

Assistant:

void BlendCase::init (void)
{
	bool useRGB = m_context.getRenderTarget().getPixelFormat().alphaBits == 0;

	static const Vec4 baseGradientColors[4] =
	{
		Vec4(0.0f, 0.5f, 1.0f, 0.5f),
		Vec4(0.5f, 0.0f, 0.5f, 1.0f),
		Vec4(0.5f, 1.0f, 0.5f, 0.0f),
		Vec4(1.0f, 0.5f, 0.0f, 0.5f)
	};

	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(m_firstQuad.color) == DE_LENGTH_OF_ARRAY(m_firstQuadInt.color));
	for (int i = 0; i < DE_LENGTH_OF_ARRAY(m_firstQuad.color); i++)
	{
		m_firstQuad.color[i]		= (baseGradientColors[i] - 0.5f) * 0.2f + 0.5f;
		m_firstQuadInt.color[i]		= m_firstQuad.color[i];

		m_secondQuad.color[i]		= (Vec4(1.0f) - baseGradientColors[i] - 0.5f) * 1.0f + 0.5f;
		m_secondQuadInt.color[i]	= m_secondQuad.color[i];
	}

	m_viewportW = de::min<int>(m_context.getRenderTarget().getWidth(),	MAX_VIEWPORT_WIDTH);
	m_viewportH = de::min<int>(m_context.getRenderTarget().getHeight(),	MAX_VIEWPORT_HEIGHT);

	m_firstQuadInt.posA		= tcu::IVec2(0,					0);
	m_secondQuadInt.posA	= tcu::IVec2(0,					0);
	m_firstQuadInt.posB		= tcu::IVec2(m_viewportW-1,		m_viewportH-1);
	m_secondQuadInt.posB	= tcu::IVec2(m_viewportW-1,		m_viewportH-1);

	DE_ASSERT(!m_renderer);
	DE_ASSERT(!m_referenceRenderer);
	DE_ASSERT(!m_refColorBuffer);

	m_renderer				= new QuadRenderer(m_context.getRenderContext(), glu::GLSL_VERSION_100_ES);
	m_referenceRenderer		= new ReferenceQuadRenderer;
	m_refColorBuffer		= new TextureLevel(TextureFormat(useRGB ? TextureFormat::RGB : TextureFormat::RGBA, TextureFormat::UNORM_INT8),
											   m_viewportW, m_viewportH);

	m_curParamSetNdx = 0;
}